

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_diag.c
# Opt level: O2

rt_function_error_t exec_matrix_diag(rt_function_t *f)

{
  uint uVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined4 uVar9;
  
  plVar2 = (long *)f->local_context;
  lVar3 = *(long *)(*plVar2 + 0x18);
  lVar4 = *(long *)(plVar2[3] + 0x18);
  uVar5 = 0;
  uVar6 = (ulong)*(uint *)(plVar2 + 2);
  if ((int)*(uint *)(plVar2 + 2) < 1) {
    uVar6 = uVar5;
  }
  for (; uVar5 != uVar6; uVar5 = uVar5 + 1) {
    uVar1 = *(uint *)((long)plVar2 + 0x2c);
    uVar7 = 0;
    if (0 < (int)uVar1) {
      uVar7 = (ulong)uVar1;
    }
    for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      uVar9 = 0;
      if (uVar8 == ((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) %
                    (long)(int)uVar1 & 0xffffffffU)) {
        uVar9 = *(undefined4 *)(lVar3 + uVar5 * 4);
      }
      *(undefined4 *)(lVar4 + (long)(int)(uVar1 * (int)uVar5) * 4 + uVar8 * 4) = uVar9;
    }
  }
  return RT_FUNCTION_ERROR_NOERROR;
}

Assistant:

rt_function_error_t exec_matrix_diag(rt_function_t *f) {
  matrix_diag_local_context_t *context =
      (matrix_diag_local_context_t *)(f->local_context);
  float *x = (float *)(context->input->data);
  float *y = (float *)(context->output->data);

  int i, j;
  for (i = 0; i < context->input_size; i++) {
    for (j = 0; j < context->last_ndim; j++) {
      if (i % context->last_ndim == j) {
        y[i * context->last_ndim + j] = x[i];
      } else {
        y[i * context->last_ndim + j] = 0.;
      }
    }
  }
  return RT_FUNCTION_ERROR_NOERROR;
}